

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O1

void Dar_BalanceCone_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  Aig_Obj_t *pObj_00;
  void **ppvVar2;
  int iVar3;
  
  while ((pObj == pRoot ||
         (((((ulong)pObj & 1) == 0 &&
           ((*(ulong *)&pObj->field_0x18 & 0xffffff80) == 0 &&
            ((*(uint *)&pRoot->field_0x18 ^ (uint)*(ulong *)&pObj->field_0x18) & 7) == 0)) &&
          (vSuper->nSize < 0x2711))))) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                    ,0x70,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                    ,0x71,"void Dar_BalanceCone_rec(Aig_Obj_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    pObj_00 = Aig_ObjReal_rec(pObj->pFanin0);
    Dar_BalanceCone_rec(pRoot,pObj_00,vSuper);
    pObj = Aig_ObjReal_rec(pObj->pFanin1);
  }
  uVar1 = vSuper->nCap;
  if (vSuper->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_004ea6fc;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,(ulong)uVar1 << 4);
      }
      vSuper->pArray = ppvVar2;
    }
    vSuper->nCap = iVar3;
  }
LAB_004ea6fc:
  iVar3 = vSuper->nSize;
  vSuper->nSize = iVar3 + 1;
  vSuper->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Dar_BalanceCone_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pObj != pRoot && (Aig_IsComplement(pObj) || Aig_ObjType(pObj) != Aig_ObjType(pRoot) || Aig_ObjRefs(pObj) > 1 || Vec_PtrSize(vSuper) > 10000) )
        Vec_PtrPush( vSuper, pObj );
    else
    {
        assert( !Aig_IsComplement(pObj) );
        assert( Aig_ObjIsNode(pObj) );
        // go through the branches
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild0(pObj) ), vSuper );
        Dar_BalanceCone_rec( pRoot, Aig_ObjReal_rec( Aig_ObjChild1(pObj) ), vSuper );
    }
}